

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect_bounder.cc
# Opt level: O3

void __thiscall
S2LatLngRectBounder::AddInternal(S2LatLngRectBounder *this,S2Point *b,S2LatLng *b_latlng)

{
  S2LatLngRect *this_00;
  VType *pVVar1;
  R1Interval *pRVar2;
  double dVar3;
  double dVar4;
  VType VVar5;
  bool bVar6;
  double dVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  S1Interval SVar12;
  R1Interval lat_ab;
  S1Interval lng_ab;
  R1Interval local_118;
  double local_108;
  double dStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  double dStack_e0;
  undefined1 local_d8 [16];
  S1Interval local_c8;
  double local_b8;
  R1Interval *local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  S2LatLngRect local_88;
  S2LatLngRect local_58;
  
  S2LatLng::ToPoint((S2Point *)&local_58,b_latlng);
  bVar6 = S2::ApproxEquals(b,(S2Point *)&local_58,(S1Angle)0x3cd203af9ee75616);
  if (!bVar6) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect_bounder.cc"
               ,0x2e,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_88.lat_.bounds_.c_[0],
               "Check failed: S2::ApproxEquals(b, b_latlng.ToPoint()) ",0x36);
    abort();
  }
  this_00 = &this->bound_;
  dVar3 = (this->bound_).lat_.bounds_.c_[0];
  pVVar1 = (this->bound_).lat_.bounds_.c_ + 1;
  if (dVar3 < *pVVar1 || dVar3 == *pVVar1) {
    pRVar2 = &(this->bound_).lat_;
    dVar3 = (this->a_).c_[0];
    dVar7 = b->c_[0];
    dVar9 = (this->a_).c_[1];
    dVar10 = (this->a_).c_[2];
    dVar11 = b->c_[1];
    dVar4 = b->c_[2];
    local_f8 = (dVar3 + dVar7) * (dVar10 - dVar4) - (dVar3 - dVar7) * (dVar4 + dVar10);
    local_e8 = (dVar3 - dVar7) * (dVar9 + dVar11) - (dVar3 + dVar7) * (dVar9 - dVar11);
    dStack_e0 = (dVar4 + dVar10) * (dVar9 - dVar11) - (dVar10 - dVar4) * (dVar9 + dVar11);
    local_108 = local_f8 * local_f8 + dStack_e0 * dStack_e0;
    local_d8._0_8_ = SQRT(local_e8 * local_e8 + local_108);
    if (1.91346e-15 <= (double)local_d8._0_8_) {
      uStack_f0 = 0;
      dStack_100 = 0.0;
      local_d8._8_8_ = 0;
      SVar12 = S1Interval::FromPointPair((this->a_latlng_).coords_.c_[1],(b_latlng->coords_).c_[1]);
      local_c8.bounds_.c_[0] = SVar12.bounds_.c_[0];
      local_c8.bounds_.c_[1] = SVar12.bounds_.c_[1];
      dVar3 = S1Interval::GetLength(&local_c8);
      if (3.1415926535897927 <= dVar3) {
        local_c8.bounds_.c_[0] = -3.141592653589793;
        local_c8.bounds_.c_[1] = 3.141592653589793;
      }
      dVar3 = (this->a_latlng_).coords_.c_[0];
      local_118.bounds_.c_[0] = (b_latlng->coords_).c_[0];
      local_118.bounds_.c_[1] =
           (VType)(~-(ulong)(local_118.bounds_.c_[0] < dVar3) & (ulong)local_118.bounds_.c_[0] |
                  -(ulong)(local_118.bounds_.c_[0] < dVar3) & (ulong)dVar3);
      uVar8 = local_d8._12_4_;
      if (dVar3 <= local_118.bounds_.c_[0]) {
        local_118.bounds_.c_[0] = dVar3;
      }
      dVar7 = local_f8 - local_e8 * 0.0;
      dVar9 = local_e8 * 0.0 - dStack_e0;
      dVar10 = dStack_e0 * 0.0 - local_f8 * 0.0;
      dVar3 = local_d8._0_8_ * 6.06638e-16 + 6.83174e-31;
      dVar11 = (this->a_).c_[2] * dVar10 + (this->a_).c_[1] * dVar9 + (this->a_).c_[0] * dVar7 + 0.0
      ;
      dVar7 = b->c_[2] * dVar10 + b->c_[1] * dVar9 + b->c_[0] * dVar7 + 0.0;
      local_b0 = pRVar2;
      if (((ABS(dVar7) <= dVar3) || (ABS(dVar11) <= dVar3)) || (dVar11 * dVar7 < 0.0)) {
        dVar9 = SQRT(local_108);
        dVar10 = ABS(local_e8);
        local_d8._8_4_ = local_d8._8_4_;
        local_d8._0_8_ = dVar3;
        local_d8._12_4_ = uVar8;
        dStack_e0 = 0.0;
        uStack_f0 = 0;
        local_108 = dVar11;
        dStack_100 = dVar7;
        local_f8 = local_118.bounds_.c_[1];
        local_e8 = local_118.bounds_.c_[0];
        local_98 = dVar7;
        dStack_90 = dVar7;
        dVar3 = atan2(dVar9,dVar10);
        local_a8 = 1.5707963267948966;
        if (dVar3 + 6.661338147750939e-16 <= 1.5707963267948966) {
          local_a8 = dVar3 + 6.661338147750939e-16;
        }
        dVar3 = (this->a_).c_[0] - b->c_[0];
        dVar7 = (this->a_).c_[1] - b->c_[1];
        dVar9 = (this->a_).c_[2] - b->c_[2];
        local_b8 = SQRT(dVar9 * dVar9 + dVar7 * dVar7 + dVar3 * dVar3) * 0.5;
        uStack_a0 = 0;
        dVar3 = sin(local_a8);
        dVar3 = asin(dVar3 * local_b8);
        dVar3 = ((dVar3 + dVar3) - (local_f8 - local_e8)) * 0.5 + 2.220446049250313e-16;
        if (((local_108 <= (double)local_d8._0_8_) && (-(double)local_d8._0_8_ <= local_98)) &&
           (local_118.bounds_.c_[1] = local_f8 + dVar3, local_a8 <= local_118.bounds_.c_[1])) {
          local_118.bounds_.c_[1] = local_a8;
        }
        if ((-(double)local_d8._0_8_ <= local_108) && (local_98 <= (double)local_d8._0_8_)) {
          local_118.bounds_.c_[0] = local_e8 - dVar3;
          if (local_118.bounds_.c_[0] <= -local_a8) {
            local_118.bounds_.c_[0] = -local_a8;
          }
        }
      }
      S2LatLngRect::S2LatLngRect(&local_88,&local_118,&local_c8);
      S2LatLngRect::Union(&local_58,this_00,&local_88);
      (((S1Interval *)(local_b0 + 1))->bounds_).c_[0] =
           (VType)CONCAT44(local_58.lng_.bounds_.c_[0]._4_4_,local_58.lng_.bounds_.c_[0]._0_4_);
      (((S1Interval *)(local_b0 + 1))->bounds_).c_[1] =
           (VType)CONCAT44(local_58.lng_.bounds_.c_[1]._4_4_,local_58.lng_.bounds_.c_[1]._0_4_);
      (local_b0->bounds_).c_[0] =
           (VType)CONCAT44(local_58.lat_.bounds_.c_[0]._4_4_,local_58.lat_.bounds_.c_[0]._0_4_);
      (local_b0->bounds_).c_[1] =
           (VType)CONCAT44(local_58.lat_.bounds_.c_[1]._4_4_,local_58.lat_.bounds_.c_[1]._0_4_);
    }
    else {
      if (0.0 <= dVar10 * dVar4 + dVar3 * dVar7 + 0.0 + dVar9 * dVar11) {
        S2LatLngRect::FromPointPair(&local_88,&this->a_latlng_,b_latlng);
        S2LatLngRect::Union(&local_58,this_00,&local_88);
      }
      else {
        local_88.super_S2Region._vptr_S2Region = (_func_int **)0xbff921fb54442d18;
        local_88.lat_.bounds_.c_[0] = 1.5707963267948966;
        local_c8.bounds_.c_[0] = -3.141592653589793;
        local_c8.bounds_.c_[1] = 3.141592653589793;
        S2LatLngRect::S2LatLngRect(&local_58,(R1Interval *)&local_88,&local_c8);
      }
      *(undefined4 *)(this->bound_).lng_.bounds_.c_ = local_58.lng_.bounds_.c_[0]._0_4_;
      *(undefined4 *)((long)(this->bound_).lng_.bounds_.c_ + 4) = local_58.lng_.bounds_.c_[0]._4_4_;
      *(undefined4 *)((this->bound_).lng_.bounds_.c_ + 1) = local_58.lng_.bounds_.c_[1]._0_4_;
      *(undefined4 *)((long)(this->bound_).lng_.bounds_.c_ + 0xc) =
           local_58.lng_.bounds_.c_[1]._4_4_;
      *(undefined4 *)(pRVar2->bounds_).c_ = local_58.lat_.bounds_.c_[0]._0_4_;
      *(undefined4 *)((long)(this->bound_).lat_.bounds_.c_ + 4) = local_58.lat_.bounds_.c_[0]._4_4_;
      *(undefined4 *)((this->bound_).lat_.bounds_.c_ + 1) = local_58.lat_.bounds_.c_[1]._0_4_;
      *(undefined4 *)((long)(this->bound_).lat_.bounds_.c_ + 0xc) =
           local_58.lat_.bounds_.c_[1]._4_4_;
    }
  }
  else {
    S2LatLngRect::AddPoint(this_00,b_latlng);
  }
  (this->a_).c_[2] = b->c_[2];
  VVar5 = b->c_[1];
  (this->a_).c_[0] = b->c_[0];
  (this->a_).c_[1] = VVar5;
  VVar5 = (b_latlng->coords_).c_[1];
  (this->a_latlng_).coords_.c_[0] = (b_latlng->coords_).c_[0];
  (this->a_latlng_).coords_.c_[1] = VVar5;
  return;
}

Assistant:

void S2LatLngRectBounder::AddInternal(const S2Point& b,
                                      const S2LatLng& b_latlng) {
  // Simple consistency check to verify that b and b_latlng are alternate
  // representations of the same vertex.
  S2_DCHECK(S2::ApproxEquals(b, b_latlng.ToPoint()));

  if (bound_.is_empty()) {
    bound_.AddPoint(b_latlng);
  } else {
    // First compute the cross product N = A x B robustly.  This is the normal
    // to the great circle through A and B.  We don't use S2::RobustCrossProd()
    // since that method returns an arbitrary vector orthogonal to A if the two
    // vectors are proportional, and we want the zero vector in that case.
    Vector3_d n = (a_ - b).CrossProd(a_ + b);  // N = 2 * (A x B)

    // The relative error in N gets large as its norm gets very small (i.e.,
    // when the two points are nearly identical or antipodal).  We handle this
    // by choosing a maximum allowable error, and if the error is greater than
    // this we fall back to a different technique.  Since it turns out that
    // the other sources of error in converting the normal to a maximum
    // latitude add up to at most 1.16 * DBL_EPSILON (see below), and it is
    // desirable to have the total error be a multiple of DBL_EPSILON, we have
    // chosen to limit the maximum error in the normal to 3.84 * DBL_EPSILON.
    // It is possible to show that the error is less than this when
    //
    //   n.Norm() >= 8 * sqrt(3) / (3.84 - 0.5 - sqrt(3)) * DBL_EPSILON
    //            = 1.91346e-15 (about 8.618 * DBL_EPSILON)
    double n_norm = n.Norm();
    if (n_norm < 1.91346e-15) {
      // A and B are either nearly identical or nearly antipodal (to within
      // 4.309 * DBL_EPSILON, or about 6 nanometers on the earth's surface).
      if (a_.DotProd(b) < 0) {
        // The two points are nearly antipodal.  The easiest solution is to
        // assume that the edge between A and B could go in any direction
        // around the sphere.
        bound_ = S2LatLngRect::Full();
      } else {
        // The two points are nearly identical (to within 4.309 * DBL_EPSILON).
        // In this case we can just use the bounding rectangle of the points,
        // since after the expansion done by GetBound() this rectangle is
        // guaranteed to include the (lat,lng) values of all points along AB.
        bound_ = bound_.Union(S2LatLngRect::FromPointPair(a_latlng_, b_latlng));
      }
    } else {
      // Compute the longitude range spanned by AB.
      S1Interval lng_ab = S1Interval::FromPointPair(a_latlng_.lng().radians(),
                                                    b_latlng.lng().radians());
      if (lng_ab.GetLength() >= M_PI - 2 * DBL_EPSILON) {
        // The points lie on nearly opposite lines of longitude to within the
        // maximum error of the calculation.  (Note that this test relies on
        // the fact that M_PI is slightly less than the true value of Pi, and
        // that representable values near M_PI are 2 * DBL_EPSILON apart.)
        // The easiest solution is to assume that AB could go on either side
        // of the pole.
        lng_ab = S1Interval::Full();
      }

      // Next we compute the latitude range spanned by the edge AB.  We start
      // with the range spanning the two endpoints of the edge:
      R1Interval lat_ab = R1Interval::FromPointPair(a_latlng_.lat().radians(),
                                                    b_latlng.lat().radians());

      // This is the desired range unless the edge AB crosses the plane
      // through N and the Z-axis (which is where the great circle through A
      // and B attains its minimum and maximum latitudes).  To test whether AB
      // crosses this plane, we compute a vector M perpendicular to this
      // plane and then project A and B onto it.
      Vector3_d m = n.CrossProd(S2Point(0, 0, 1));
      double m_a = m.DotProd(a_);
      double m_b = m.DotProd(b);

      // We want to test the signs of "m_a" and "m_b", so we need to bound
      // the error in these calculations.  It is possible to show that the
      // total error is bounded by
      //
      //  (1 + sqrt(3)) * DBL_EPSILON * n_norm + 8 * sqrt(3) * (DBL_EPSILON**2)
      //    = 6.06638e-16 * n_norm + 6.83174e-31

      double m_error = 6.06638e-16 * n_norm + 6.83174e-31;
      if (m_a * m_b < 0 || fabs(m_a) <= m_error || fabs(m_b) <= m_error) {
        // Minimum/maximum latitude *may* occur in the edge interior.
        //
        // The maximum latitude is 90 degrees minus the latitude of N.  We
        // compute this directly using atan2 in order to get maximum accuracy
        // near the poles.
        //
        // Our goal is compute a bound that contains the computed latitudes of
        // all S2Points P that pass the point-in-polygon containment test.
        // There are three sources of error we need to consider:
        //  - the directional error in N (at most 3.84 * DBL_EPSILON)
        //  - converting N to a maximum latitude
        //  - computing the latitude of the test point P
        // The latter two sources of error are at most 0.955 * DBL_EPSILON
        // individually, but it is possible to show by a more complex analysis
        // that together they can add up to at most 1.16 * DBL_EPSILON, for a
        // total error of 5 * DBL_EPSILON.
        //
        // We add 3 * DBL_EPSILON to the bound here, and GetBound() will pad
        // the bound by another 2 * DBL_EPSILON.
        double max_lat = min(
            atan2(sqrt(n[0]*n[0] + n[1]*n[1]), fabs(n[2])) + 3 * DBL_EPSILON,
            M_PI_2);

        // In order to get tight bounds when the two points are close together,
        // we also bound the min/max latitude relative to the latitudes of the
        // endpoints A and B.  First we compute the distance between A and B,
        // and then we compute the maximum change in latitude between any two
        // points along the great circle that are separated by this distance.
        // This gives us a latitude change "budget".  Some of this budget must
        // be spent getting from A to B; the remainder bounds the round-trip
        // distance (in latitude) from A or B to the min or max latitude
        // attained along the edge AB.
        double lat_budget = 2 * asin(0.5 * (a_ - b).Norm() * sin(max_lat));
        double max_delta = 0.5*(lat_budget - lat_ab.GetLength()) + DBL_EPSILON;

        // Test whether AB passes through the point of maximum latitude or
        // minimum latitude.  If the dot product(s) are small enough then the
        // result may be ambiguous.
        if (m_a <= m_error && m_b >= -m_error) {
          lat_ab.set_hi(min(max_lat, lat_ab.hi() + max_delta));
        }
        if (m_b <= m_error && m_a >= -m_error) {
          lat_ab.set_lo(max(-max_lat, lat_ab.lo() - max_delta));
        }
      }
      bound_ = bound_.Union(S2LatLngRect(lat_ab, lng_ab));
    }
  }
  a_ = b;
  a_latlng_ = b_latlng;
}